

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTAudioEngine_CreateInMemoryWaveBank
                   (FACTAudioEngine *pEngine,void *pvBuffer,uint32_t dwSize,uint32_t dwFlags,
                   uint32_t dwAllocAttributes,FACTWaveBank **ppWaveBank)

{
  uint32_t uVar1;
  FAudioIOStream *io;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  io = FAudio_memopen(pvBuffer,dwSize);
  uVar1 = FACT_INTERNAL_ParseWaveBank
                    (pEngine,io,0,0,FACT_INTERNAL_DefaultReadFile,
                     FACT_INTERNAL_DefaultGetOverlappedResult,0,ppWaveBank);
  FAudio_PlatformUnlockMutex(pEngine->apiLock);
  return uVar1;
}

Assistant:

uint32_t FACTAudioEngine_CreateInMemoryWaveBank(
	FACTAudioEngine *pEngine,
	const void *pvBuffer,
	uint32_t dwSize,
	uint32_t dwFlags,
	uint32_t dwAllocAttributes,
	FACTWaveBank **ppWaveBank
) {
	uint32_t retval;
	FAudio_PlatformLockMutex(pEngine->apiLock);
	retval = FACT_INTERNAL_ParseWaveBank(
		pEngine,
		FAudio_memopen((void*) pvBuffer, dwSize),
		0,
		0,
		FACT_INTERNAL_DefaultReadFile,
		FACT_INTERNAL_DefaultGetOverlappedResult,
		0,
		ppWaveBank
	);
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return retval;
}